

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_compose.cxx
# Opt level: O3

int Fl::compose(int *del)

{
  byte bVar1;
  
  bVar1 = *e_text;
  if (-1 < (char)bVar1 && (e_state._2_1_ & 0x4c) != 0) {
    *del = 0;
    return 0;
  }
  *del = compose_state;
  compose_state = 0;
  return (int)(bVar1 != 0x7f && 0x1f < bVar1);
}

Assistant:

int Fl::compose(int& del) {
  int condition;
#if defined(__APPLE__)
  int has_text_key = Fl::compose_state || Fl::e_keysym <= '~' || Fl::e_keysym == FL_Iso_Key ||
  (Fl::e_keysym >= FL_KP && Fl::e_keysym <= FL_KP_Last && Fl::e_keysym != FL_KP_Enter);
  condition = Fl::e_state&(FL_META | FL_CTRL) || 
      (Fl::e_keysym >= FL_Shift_L && Fl::e_keysym <= FL_Alt_R) || // called from flagsChanged
      !has_text_key ;
#else
unsigned char ascii = (unsigned char)e_text[0];
#if defined(WIN32)
  condition = (e_state & (FL_ALT | FL_META)) && !(ascii & 128) ;
#else
  condition = (e_state & (FL_ALT | FL_META | FL_CTRL)) && !(ascii & 128) ;
#endif // WIN32
#endif // __APPLE__
  if (condition) { del = 0; return 0;} // this stuff is to be treated as a function key
  del = Fl::compose_state;
#ifdef __APPLE__
  Fl::compose_state = Fl_X::next_marked_length;
#else
  Fl::compose_state = 0;
// Only insert non-control characters:
  if ( (!Fl::compose_state) && ! (ascii & ~31 && ascii!=127)) { return 0; }
#endif
  return 1;
}